

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

void __thiscall duckdb::RowGroup::RevertAppend(RowGroup *this,idx_t row_group_start)

{
  pointer psVar1;
  ulong uVar2;
  RowVersionManager *this_00;
  ColumnData *pCVar3;
  ulong uVar4;
  shared_ptr<duckdb::ColumnData,_true> *column;
  pointer this_01;
  
  this_00 = GetOrCreateVersionInfo(this);
  RowVersionManager::RevertAppend
            (this_00,row_group_start - (this->super_SegmentBase<duckdb::RowGroup>).start);
  psVar1 = (this->columns).
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->columns).
                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1
      ) {
    pCVar3 = shared_ptr<duckdb::ColumnData,_true>::operator->(this_01);
    (*pCVar3->_vptr_ColumnData[0x14])(pCVar3,row_group_start);
  }
  uVar4 = row_group_start - (this->super_SegmentBase<duckdb::RowGroup>).start;
  uVar2 = (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  if (uVar2 <= uVar4) {
    uVar4 = uVar2;
  }
  LOCK();
  (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i = uVar4;
  UNLOCK();
  return;
}

Assistant:

void RowGroup::RevertAppend(idx_t row_group_start) {
	auto &vinfo = GetOrCreateVersionInfo();
	vinfo.RevertAppend(row_group_start - this->start);
	for (auto &column : columns) {
		column->RevertAppend(UnsafeNumericCast<row_t>(row_group_start));
	}
	this->count = MinValue<idx_t>(row_group_start - this->start, this->count);
	Verify();
}